

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.cpp
# Opt level: O0

void __thiscall
cfd::core::ScriptWitness::SetWitnessStack(ScriptWitness *this,uint32_t index,ByteData *data)

{
  size_type sVar1;
  undefined8 uVar2;
  ByteData *in_stack_ffffffffffffff68;
  ByteData *this_00;
  string *message;
  CfdError error_code;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffff94;
  undefined1 local_59 [33];
  CfdSourceLocation local_38;
  ByteData *local_20;
  ByteData *data_local;
  ScriptWitness *pSStack_10;
  uint32_t index_local;
  ScriptWitness *this_local;
  
  local_20 = data;
  data_local._4_4_ = index;
  pSStack_10 = this;
  sVar1 = ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                    (&this->witness_stack_);
  if (sVar1 <= data_local._4_4_) {
    local_38.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_transaction_common.cpp"
                 ,0x2f);
    error_code = (CfdError)((ulong)this >> 0x20);
    local_38.filename = local_38.filename + 1;
    local_38.line = 0x32;
    local_38.funcname = "SetWitnessStack";
    logger::warn<unsigned_int&>
              (&local_38,"WitnessStack[{}] out_of_range.",(uint *)((long)&data_local + 4));
    uVar3 = CONCAT13(1,(int3)in_stack_ffffffffffffff90);
    uVar2 = __cxa_allocate_exception(0x30);
    message = (string *)local_59;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)(local_59 + 1),"vin out_of_range error.",(allocator *)message);
    CfdException::CfdException
              ((CfdException *)CONCAT44(in_stack_ffffffffffffff94,uVar3),error_code,message);
    __cxa_throw(uVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  this_00 = local_20;
  ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
            (&this->witness_stack_,(ulong)data_local._4_4_);
  ByteData::operator=(this_00,in_stack_ffffffffffffff68);
  return;
}

Assistant:

void ScriptWitness::SetWitnessStack(uint32_t index, const ByteData &data) {
  if (witness_stack_.size() <= index) {
    warn(CFD_LOG_SOURCE, "WitnessStack[{}] out_of_range.", index);
    throw CfdException(kCfdOutOfRangeError, "vin out_of_range error.");
  }
  witness_stack_[index] = data;
}